

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

void golf_shader_uniform_set_vec4(golf_shader_uniform_t *uniform,char *name,vec4 v)

{
  char *pcVar1;
  int iVar2;
  int local_34;
  golf_shader_uniform_member_t *pgStack_30;
  int i;
  golf_shader_uniform_member_t *member;
  char *name_local;
  golf_shader_uniform_t *uniform_local;
  vec4 v_local;
  
  pgStack_30 = (golf_shader_uniform_member_t *)0x0;
  for (local_34 = 0; local_34 < (uniform->members).length; local_34 = local_34 + 1) {
    iVar2 = strcmp((uniform->members).data[local_34].name,name);
    if ((iVar2 == 0) && ((uniform->members).data[local_34].size == 0x10)) {
      pgStack_30 = (uniform->members).data + local_34;
    }
  }
  if (pgStack_30 == (golf_shader_uniform_member_t *)0x0) {
    golf_log_warning("Unable to find vec4 member: %s",name);
  }
  else {
    pcVar1 = uniform->data;
    iVar2 = pgStack_30->offset;
    *(long *)(pcVar1 + iVar2) = v._0_8_;
    *(long *)(pcVar1 + (long)iVar2 + 8) = v._8_8_;
  }
  return;
}

Assistant:

void golf_shader_uniform_set_vec4(golf_shader_uniform_t *uniform, const char *name, vec4 v) {
    golf_shader_uniform_member_t *member = NULL;
    for (int i = 0; i < uniform->members.length; i++) {
        if ((strcmp(uniform->members.data[i].name, name) == 0) && uniform->members.data[i].size == 16) {
            member = &uniform->members.data[i];
        }
    }
    if (!member) {
        golf_log_warning("Unable to find vec4 member: %s", name);
        return;
    }
    memcpy(uniform->data + member->offset, &v, 16);
}